

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMetadata.cpp
# Opt level: O3

void __thiscall
utMetadata_get_set_pod_Test_Test::~utMetadata_get_set_pod_Test_Test
          (utMetadata_get_set_pod_Test_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utMetadata, get_set_pod_Test ) {
    m_data = aiMetadata::Alloc( 5 );

    // int, 32 bit
    unsigned int index( 0 );
    bool success( false );
    const std::string key_int = "test_int";
    success = m_data->Set( index, key_int, 1 );
    EXPECT_TRUE( success );
    success = m_data->Set( index + 10, key_int, 1 );
    EXPECT_FALSE( success );

    // unsigned int, 64 bit
    index++;
    const std::string key_uint = "test_uint";
    success = m_data->Set<uint64_t>( index, key_uint, 1UL );
    EXPECT_TRUE( success );
    uint64_t result_uint( 0 );
    success = m_data->Get( key_uint, result_uint );
    EXPECT_TRUE( success );
    EXPECT_EQ( 1UL, result_uint );

    // bool
    index++;
    const std::string key_bool = "test_bool";
    success = m_data->Set( index, key_bool, true );
    EXPECT_TRUE( success );
    bool result_bool( false );
    success = m_data->Get( key_bool, result_bool );
    EXPECT_TRUE( success );
    EXPECT_EQ( true, result_bool );

    // float
    index++;
    const std::string key_float = "test_float";
    float fVal = 2.0f;
    success = m_data->Set( index, key_float, fVal );
    EXPECT_TRUE( success );
    float result_float( 0.0f );
    success = m_data->Get( key_float, result_float );
    EXPECT_TRUE( success );
    EXPECT_FLOAT_EQ( 2.0f, result_float );

    // double
    index++;
    const std::string key_double = "test_double";
    double dVal = 3.0;
    success = m_data->Set( index, key_double, dVal );
    EXPECT_TRUE( success );
    double result_double( 0.0 );
    success = m_data->Get( key_double, result_double );
    EXPECT_TRUE( success );
    EXPECT_DOUBLE_EQ( 3.0, result_double );

    // error
    int result;
    success = m_data->Get( "bla", result );
    EXPECT_FALSE( success );
}